

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

int luaopen_table(lua_State *L)

{
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,7);
  luaL_setfuncs(L,tab_funcs,0);
  return 1;
}

Assistant:

LUAMOD_API int luaopen_table(lua_State *L) {
    luaL_newlib(L, tab_funcs);
#if defined(LUA_COMPAT_UNPACK)
    /* _G.unpack = table.unpack */
    lua_getfield(L, -1, "unpack");
    lua_setglobal(L, "unpack");
#endif
    return 1;
}